

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-util.cpp
# Opt level: O2

void grind_task(uint32_t nBits,CBlockHeader header,uint32_t offset,uint32_t step,atomic<bool> *found
               ,uint32_t *proposed_nonce)

{
  __int_type _Var1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  arith_uint256 target;
  bool local_9a;
  bool local_99;
  uint256 local_98;
  base_uint<256U> local_78;
  base_uint<256U> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint<256U>::base_uint(&local_58);
  arith_uint256::SetCompact((arith_uint256 *)&local_58,nBits,&local_99,&local_9a);
  bVar2 = base_uint<256U>::EqualTo(&local_58,0);
  if (((!bVar2) && (local_99 == false)) && (local_9a == false)) {
    uVar3 = (~step - ~step % step) + offset;
    header.nNonce = offset;
    while ((((found->_M_base)._M_i & 1U) == 0 && (header.nNonce < uVar3))) {
      uVar4 = header.nNonce + step * 5000;
      if (uVar3 - header.nNonce < step * 5000) {
        uVar4 = uVar3;
      }
      do {
        CBlockHeader::GetHash(&local_98,&header);
        UintToArith256((arith_uint256 *)&local_78,&local_98);
        bVar2 = operator<=(&local_78,&local_58);
        if (bVar2) {
          LOCK();
          _Var1 = (found->_M_base)._M_i;
          (found->_M_base)._M_i = true;
          UNLOCK();
          if ((_Var1 & 1U) == 0) {
            *proposed_nonce = header.nNonce;
          }
          goto LAB_0010b286;
        }
        header.nNonce = header.nNonce + step;
      } while (header.nNonce != uVar4);
    }
  }
LAB_0010b286:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void grind_task(uint32_t nBits, CBlockHeader header, uint32_t offset, uint32_t step, std::atomic<bool>& found, uint32_t& proposed_nonce)
{
    arith_uint256 target;
    bool neg, over;
    target.SetCompact(nBits, &neg, &over);
    if (target == 0 || neg || over) return;
    header.nNonce = offset;

    uint32_t finish = std::numeric_limits<uint32_t>::max() - step;
    finish = finish - (finish % step) + offset;

    while (!found && header.nNonce < finish) {
        const uint32_t next = (finish - header.nNonce < 5000*step) ? finish : header.nNonce + 5000*step;
        do {
            if (UintToArith256(header.GetHash()) <= target) {
                if (!found.exchange(true)) {
                    proposed_nonce = header.nNonce;
                }
                return;
            }
            header.nNonce += step;
        } while(header.nNonce != next);
    }
}